

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void * mwUnmark(void *p,char *file,uint line)

{
  mwMarker *local_38;
  mwMarker *prv;
  mwMarker *mrk;
  uint line_local;
  char *file_local;
  void *p_local;
  
  prv = mwFirstMark;
  local_38 = (mwMarker *)0x0;
  while( true ) {
    if (prv == (mwMarker *)0x0) {
      mwWrite("mark: %s(%d), no mark found for %p\n",file,(ulong)line,p);
      return p;
    }
    if (prv->host == p) break;
    local_38 = prv;
    prv = prv->next;
  }
  if (prv->level < 2) {
    if (local_38 == (mwMarker *)0x0) {
      mwFirstMark = prv->next;
    }
    else {
      local_38->next = prv->next;
    }
    free(prv->text);
    free(prv);
    return p;
  }
  prv->level = prv->level + -1;
  return p;
}

Assistant:

void *mwUnmark(void *p, const char *file, unsigned line)
{
	mwMarker *mrk, *prv;
	mrk = mwFirstMark;
	prv = NULL;
	while (mrk) {
		if (mrk->host == p) {
			if (mrk->level < 2) {
				if (prv) {
					prv->next = mrk->next;
				} else {
					mwFirstMark = mrk->next;
				}
				free(mrk->text);
				free(mrk);
				return p;
			}
			mrk->level --;
			return p;
		}
		prv = mrk;
		mrk = mrk->next;
	}
	mwWrite("mark: %s(%d), no mark found for %p\n", file, line, p);
	return p;
}